

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_lha.c
# Opt level: O2

wchar_t archive_read_format_lha_bid(archive_read *a,wchar_t best_bid)

{
  ssize_t in_RAX;
  char *h;
  size_t sVar1;
  void *pvVar2;
  wchar_t wVar3;
  ulong uVar4;
  void *h_00;
  long lVar5;
  ulong uVar6;
  bool bVar7;
  ssize_t bytes_avail;
  
  wVar3 = L'\xffffffff';
  if ((best_bid < L'\x1f') &&
     (bytes_avail = in_RAX, h = (char *)__archive_read_ahead(a,0x16,(ssize_t *)0x0),
     h != (char *)0x0)) {
    sVar1 = lha_check_header_format(h);
    if (sVar1 == 0) {
      wVar3 = L'\x1e';
    }
    else {
      wVar3 = L'\0';
      if ((*h == 'M') && (h[1] == 'Z')) {
        uVar4 = 0x1000;
        wVar3 = L'\0';
        lVar5 = 0;
        while (lVar5 < 0x5000) {
          while (pvVar2 = __archive_read_ahead(a,lVar5 + uVar4,&bytes_avail), pvVar2 == (void *)0x0)
          {
            bVar7 = uVar4 < 0x32;
            uVar4 = uVar4 >> 1;
            if (bVar7) {
              return L'\0';
            }
          }
          uVar6 = bytes_avail + (long)pvVar2;
          for (h_00 = (void *)(lVar5 + (long)pvVar2); (long)h_00 + 0x16U < uVar6;
              h_00 = (void *)((long)h_00 + sVar1)) {
            sVar1 = lha_check_header_format(h_00);
            if (sVar1 == 0) {
              return L'\x1e';
            }
          }
          lVar5 = (long)h_00 - (long)pvVar2;
        }
      }
    }
  }
  return wVar3;
}

Assistant:

static int
archive_read_format_lha_bid(struct archive_read *a, int best_bid)
{
	const char *p;
	const void *buff;
	ssize_t bytes_avail, offset, window;
	size_t next;

	/* If there's already a better bid than we can ever
	   make, don't bother testing. */
	if (best_bid > 30)
		return (-1);

	if ((p = __archive_read_ahead(a, H_SIZE, NULL)) == NULL)
		return (-1);

	if (lha_check_header_format(p) == 0)
		return (30);

	if (p[0] == 'M' && p[1] == 'Z') {
		/* PE file */
		offset = 0;
		window = 4096;
		while (offset < (1024 * 20)) {
			buff = __archive_read_ahead(a, offset + window,
			    &bytes_avail);
			if (buff == NULL) {
				/* Remaining bytes are less than window. */
				window >>= 1;
				if (window < (H_SIZE + 3))
					return (0);
				continue;
			}
			p = (const char *)buff + offset;
			while (p + H_SIZE < (const char *)buff + bytes_avail) {
				if ((next = lha_check_header_format(p)) == 0)
					return (30);
				p += next;
			}
			offset = p - (const char *)buff;
		}
	}
	return (0);
}